

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void destroyRootPage(Parse *pParse,int iTable,int iDb)

{
  uint p2;
  Vdbe *p;
  int r1;
  Vdbe *v;
  int iDb_local;
  int iTable_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  p2 = sqlite3GetTempReg(pParse);
  sqlite3VdbeAddOp3(p,0x82,iTable,p2,iDb);
  sqlite3MayAbort(pParse);
  sqlite3NestedParse(pParse,"UPDATE %Q.%s SET rootpage=%d WHERE #%d AND rootpage=#%d",
                     pParse->db->aDb[iDb].zDbSName,"sqlite_master",(ulong)(uint)iTable,(ulong)p2,p2)
  ;
  sqlite3ReleaseTempReg(pParse,p2);
  return;
}

Assistant:

static void destroyRootPage(Parse *pParse, int iTable, int iDb){
  Vdbe *v = sqlite3GetVdbe(pParse);
  int r1 = sqlite3GetTempReg(pParse);
  assert( iTable>1 );
  sqlite3VdbeAddOp3(v, OP_Destroy, iTable, r1, iDb);
  sqlite3MayAbort(pParse);
#ifndef SQLITE_OMIT_AUTOVACUUM
  /* OP_Destroy stores an in integer r1. If this integer
  ** is non-zero, then it is the root page number of a table moved to
  ** location iTable. The following code modifies the sqlite_master table to
  ** reflect this.
  **
  ** The "#NNN" in the SQL is a special constant that means whatever value
  ** is in register NNN.  See grammar rules associated with the TK_REGISTER
  ** token for additional information.
  */
  sqlite3NestedParse(pParse, 
     "UPDATE %Q.%s SET rootpage=%d WHERE #%d AND rootpage=#%d",
     pParse->db->aDb[iDb].zDbSName, MASTER_NAME, iTable, r1, r1);
#endif
  sqlite3ReleaseTempReg(pParse, r1);
}